

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip_x86.cpp
# Opt level: O1

int __thiscall ncnn::Clip_x86::forward_inplace(Clip_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  _func_int **pp_Var4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  int iVar9;
  ulong uVar10;
  undefined1 (*pauVar11) [16];
  int iVar12;
  float *pfVar13;
  undefined1 auVar14 [16];
  
  uVar3 = bottom_top_blob->c;
  iVar9 = bottom_top_blob->h * bottom_top_blob->w;
  if (bottom_top_blob->elempack == 4) {
    if (0 < (int)uVar3) {
      pp_Var4 = this->_vptr_Clip_x86;
      uVar10 = 0;
      do {
        if (0 < iVar9) {
          uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var4[-3]);
          uVar2 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var4[-3]);
          pauVar11 = (undefined1 (*) [16])
                     (bottom_top_blob->cstep * uVar10 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          iVar12 = iVar9;
          do {
            auVar14._4_4_ = uVar1;
            auVar14._0_4_ = uVar1;
            auVar14._8_4_ = uVar1;
            auVar14._12_4_ = uVar1;
            auVar14 = maxps(*pauVar11,auVar14);
            auVar8._4_4_ = uVar2;
            auVar8._0_4_ = uVar2;
            auVar8._8_4_ = uVar2;
            auVar8._12_4_ = uVar2;
            auVar14 = minps(auVar14,auVar8);
            *pauVar11 = auVar14;
            pauVar11 = pauVar11 + 1;
            iVar12 = iVar12 + -1;
          } while (iVar12 != 0);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar3);
    }
  }
  else if (0 < (int)uVar3) {
    pvVar5 = bottom_top_blob->data;
    sVar6 = bottom_top_blob->cstep;
    pp_Var4 = this->_vptr_Clip_x86;
    sVar7 = bottom_top_blob->elemsize;
    uVar10 = 0;
    do {
      if (0 < iVar9) {
        pfVar13 = (float *)(sVar6 * sVar7 * uVar10 + (long)pvVar5);
        iVar12 = iVar9 + 1;
        do {
          if (*pfVar13 < *(float *)(&this->field_0xd0 + (long)pp_Var4[-3])) {
            *pfVar13 = *(float *)(&this->field_0xd0 + (long)pp_Var4[-3]);
          }
          if (*(float *)(&this->field_0xd4 + (long)pp_Var4[-3]) < *pfVar13) {
            *pfVar13 = *(float *)(&this->field_0xd4 + (long)pp_Var4[-3]);
          }
          pfVar13 = pfVar13 + 1;
          iVar12 = iVar12 + -1;
        } while (1 < iVar12);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar3);
  }
  return 0;
}

Assistant:

int Clip_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m256 _max = _mm256_set1_ps(max);
            __m256 _min = _mm256_set1_ps(min);

            for (int i = 0; i < size; i++)
            {
                __m256 _ptr = _mm256_loadu_ps(ptr);
                _ptr = _mm256_max_ps(_ptr, _min);
                _ptr = _mm256_min_ps(_ptr, _max);
                _mm256_storeu_ps(ptr, _ptr);

                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m128 _max = _mm_set1_ps(max);
            __m128 _min = _mm_set1_ps(min);

            for (int i = 0; i < size; i++)
            {
                __m128 _ptr = _mm_loadu_ps(ptr);
                _ptr = _mm_max_ps(_ptr, _min);
                _ptr = _mm_min_ps(_ptr, _max);
                _mm_storeu_ps(ptr, _ptr);

                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int remain = size;
        for (; remain > 0; remain--)
        {
            if (*ptr < min)
                *ptr = min;

            if (*ptr > max)
                *ptr = max;

            ptr++;
        }
    }

    return 0;
}